

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrDec.c
# Opt level: O0

void Rwr_ManPreprocess(Rwr_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  unsigned_short *puVar4;
  Vec_Vec_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  Rwr_Node_t *pNode_00;
  Rwr_Node_t *pGraph_00;
  int local_28;
  int local_24;
  int k;
  int i;
  Rwr_Node_t *pNode;
  Dec_Graph_t *pGraph;
  Rwr_Man_t *p_local;
  
  puVar4 = (unsigned_short *)malloc(0x1bc);
  p->pMapInv = puVar4;
  memset(p->pMapInv,0,0x1bc);
  pVVar5 = Vec_VecStart(0xde);
  p->vClasses = pVVar5;
  local_24 = 0;
  do {
    if (p->nFuncs <= local_24) {
      local_24 = 0;
      do {
        iVar2 = Vec_VecSize(p->vClasses);
        if (iVar2 <= local_24) {
          return;
        }
        local_28 = 0;
        while( true ) {
          pVVar6 = Vec_VecEntry(p->vClasses,local_24);
          iVar2 = Vec_PtrSize(pVVar6);
          if (iVar2 <= local_28) break;
          pVVar6 = Vec_VecEntry(p->vClasses,local_24);
          pNode_00 = (Rwr_Node_t *)Vec_PtrEntry(pVVar6,local_28);
          pGraph_00 = (Rwr_Node_t *)Rwr_NodePreprocess(p,pNode_00);
          pNode_00->pNext = pGraph_00;
          uVar1 = *(uint *)&pNode_00->field_0xe;
          uVar3 = Dec_GraphDeriveTruth((Dec_Graph_t *)pGraph_00);
          if ((uVar1 & 0xffff) != (uVar3 & 0xffff)) {
            __assert_fail("pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrDec.c"
                          ,0x4c,"void Rwr_ManPreprocess(Rwr_Man_t *)");
          }
          local_28 = local_28 + 1;
        }
        local_24 = local_24 + 1;
      } while( true );
    }
    if (p->pTable[local_24] != (Rwr_Node_t *)0x0) {
      for (_k = p->pTable[local_24]; _k != (Rwr_Node_t *)0x0; _k = _k->pNext) {
        if ((*(uint *)&_k->field_0xe & 0xffff) !=
            (*(uint *)&p->pTable[local_24]->field_0xe & 0xffff)) {
          __assert_fail("pNode->uTruth == p->pTable[i]->uTruth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrDec.c"
                        ,0x41,"void Rwr_ManPreprocess(Rwr_Man_t *)");
        }
        if (0xdd < p->pMap[*(uint *)&_k->field_0xe & 0xffff]) {
          __assert_fail("p->pMap[pNode->uTruth] < 222",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrDec.c"
                        ,0x42,"void Rwr_ManPreprocess(Rwr_Man_t *)");
        }
        Vec_VecPush(p->vClasses,(uint)p->pMap[*(uint *)&_k->field_0xe & 0xffff],_k);
        p->pMapInv[p->pMap[*(uint *)&_k->field_0xe & 0xffff]] =
             p->puCanons[*(uint *)&_k->field_0xe & 0xffff];
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Rwr_ManPreprocess( Rwr_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwr_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Guaranteed to be >=0 b/c unsigned
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwr_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwr_NodePreprocess( p, pNode );
        pNode->pNext = (Rwr_Node_t *)pGraph;
        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}